

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void run(void)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int path [16];
  
  lVar1 = 0;
  iVar2 = nodeNum;
  for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
    if ((0 < *(int *)((long)outDegrees + lVar1)) && (0 < *(int *)((long)inDegrees + lVar1))) {
      iVar2 = (int)lVar3;
      dfs_range1(iVar2,iVar2,1);
      dfs_range2(iVar2,iVar2,1);
      dfs(iVar2,iVar2,1,path);
      iVar2 = nodeNum;
    }
    lVar1 = lVar1 + 4;
  }
  return;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}